

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHolder.cpp
# Opt level: O0

ssize_t __thiscall Storage::FileHolder::read(FileHolder *this,int __fd,void *__buf,size_t __nbytes)

{
  uchar *__ptr;
  size_t __new_size;
  undefined4 in_register_00000034;
  allocator<unsigned_char> local_22;
  undefined1 local_21;
  void *local_20;
  size_t size_local;
  FileHolder *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  local_21 = 0;
  local_20 = __buf;
  size_local = (size_t)CONCAT44(in_register_00000034,__fd);
  this_local = this;
  std::allocator<unsigned_char>::allocator(&local_22);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(size_type)__buf,
             &local_22);
  std::allocator<unsigned_char>::~allocator(&local_22);
  __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  __new_size = fread(__ptr,1,(size_t)local_20,*(FILE **)CONCAT44(in_register_00000034,__fd));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,__new_size);
  return (ssize_t)this;
}

Assistant:

std::vector<uint8_t> FileHolder::read(std::size_t size) {
	std::vector<uint8_t> result(size);
	result.resize(std::fread(result.data(), 1, size, file_));
	return result;
}